

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpvector.hpp
# Opt level: O0

void __thiscall QpVector::sanitize(QpVector *this,double threshold)

{
  value_type vVar1;
  reference pvVar2;
  reference pvVar3;
  int *in_RDI;
  double in_XMM0_Qa;
  HighsInt i;
  HighsInt new_idx;
  int local_18;
  int local_14;
  
  local_14 = 0;
  for (local_18 = 0; local_18 < *in_RDI; local_18 = local_18 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_18);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)*pvVar2);
    if (ABS(*pvVar3) <= in_XMM0_Qa) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_18);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)*pvVar2);
      *pvVar3 = 0.0;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_18);
      *pvVar2 = 0;
    }
    else {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_18);
      vVar1 = *pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_14);
      *pvVar2 = vVar1;
      local_14 = local_14 + 1;
    }
  }
  *in_RDI = local_14;
  return;
}

Assistant:

void sanitize(double threshold = 1e-14) {
    HighsInt new_idx = 0;

    for (HighsInt i = 0; i < num_nz; i++) {
      if (fabs(value[index[i]]) > threshold) {
        index[new_idx++] = index[i];
      } else {
        value[index[i]] = 0.0;
        index[i] = 0;
      }
    }
    num_nz = new_idx;
  }